

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astring.c
# Opt level: O2

void AString_trimFront(AString *str,char c)

{
  ulong uVar1;
  ulong uVar2;
  size_t __n;
  char *__dest;
  
  if (str != (AString *)0x0) {
    __dest = str->buffer;
    uVar1 = 0;
    do {
      uVar2 = uVar1;
      if (__dest[uVar2] != c) break;
      uVar1 = uVar2 + 1;
    } while (uVar2 < str->size);
    __n = (str->size + 1) - (uVar2 + 1);
    str->size = __n;
    if (__n != 0) {
      memmove(__dest,__dest + uVar2,__n);
      __n = str->size;
      __dest = str->buffer;
    }
    __dest[__n] = '\0';
  }
  return;
}

Assistant:

ACUTILS_HD_FUNC void AString_trimFront(struct AString *str, char c)
{
    size_t trimCount = 0;
    if(str == nullptr)
        return;
    while(str->buffer[trimCount] == c && trimCount < str->size)
        ++trimCount;
    str->size -= trimCount;
    if(str->size > 0)
        memmove(str->buffer, str->buffer + trimCount, str->size);
    str->buffer[str->size] = '\0';
}